

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::FixVariablePS::FixVariablePS(FixVariablePS *this,FixVariablePS *old)

{
  double dVar1;
  int iVar2;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006ab348;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar2 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FixVariablePS_006ab898;
  iVar2 = old->m_old_j;
  this->m_j = old->m_j;
  this->m_old_j = iVar2;
  dVar1 = old->m_obj;
  this->m_val = old->m_val;
  this->m_obj = dVar1;
  dVar1 = old->m_upper;
  this->m_lower = old->m_lower;
  this->m_upper = dVar1;
  this->m_correctIdx = old->m_correctIdx;
  DSVectorBase<double>::DSVectorBase(&this->m_col,&old->m_col);
  return;
}

Assistant:

FixVariablePS(const FixVariablePS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_old_j(old.m_old_j)
         , m_val(old.m_val)
         , m_obj(old.m_obj)
         , m_lower(old.m_lower)
         , m_upper(old.m_upper)
         , m_correctIdx(old.m_correctIdx)
         , m_col(old.m_col)
      {}